

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMap.cpp
# Opt level: O2

StringMapEntryBase * __thiscall llvm::StringMapImpl::RemoveKey(StringMapImpl *this,StringRef Key)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  StringMapEntryBase *pSVar4;
  
  iVar3 = FindKey(this,Key);
  if (iVar3 == -1) {
    pSVar4 = (StringMapEntryBase *)0x0;
  }
  else {
    pSVar4 = this->TheTable[iVar3];
    this->TheTable[iVar3] = (StringMapEntryBase *)0xfffffffffffffff8;
    uVar1 = this->NumItems;
    uVar2 = this->NumTombstones;
    this->NumItems = uVar1 - 1;
    this->NumTombstones = uVar2 + 1;
    if (this->NumBuckets < uVar2 + uVar1) {
      __assert_fail("NumItems + NumTombstones <= NumBuckets",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/StringMap.cpp"
                    ,0xc2,"StringMapEntryBase *llvm::StringMapImpl::RemoveKey(StringRef)");
    }
  }
  return pSVar4;
}

Assistant:

StringMapEntryBase *StringMapImpl::RemoveKey(StringRef Key) {
  int Bucket = FindKey(Key);
  if (Bucket == -1) return nullptr;

  StringMapEntryBase *Result = TheTable[Bucket];
  TheTable[Bucket] = getTombstoneVal();
  --NumItems;
  ++NumTombstones;
  assert(NumItems + NumTombstones <= NumBuckets);

  return Result;
}